

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::RandSeqProductionSymbol::serializeTo
          (RandSeqProductionSymbol *this,ASTSerializer *serializer)

{
  pointer pRVar1;
  pointer ppPVar2;
  size_t sVar3;
  pointer ppFVar4;
  ProdBase *pPVar5;
  long lVar6;
  Type *__n;
  pointer pRVar7;
  CaseItem *item;
  long *plVar8;
  long lVar9;
  long *plVar10;
  pointer ppPVar11;
  long lVar12;
  span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL> sVar13;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  string_view name_17;
  string_view name_18;
  string_view name_19;
  string_view name_20;
  string_view name_21;
  
  __n = DeclaredType::getType(&this->declaredReturnType);
  ASTSerializer::write(serializer,10,"returnType",(size_t)__n);
  name._M_str = "arguments";
  name._M_len = 9;
  ASTSerializer::startArray(serializer,name);
  sVar3 = (this->arguments)._M_extent._M_extent_value;
  if (sVar3 != 0) {
    ppFVar4 = (this->arguments)._M_ptr;
    lVar9 = 0;
    do {
      ASTSerializer::serialize(serializer,*(Symbol **)((long)ppFVar4 + lVar9),false);
      lVar9 = lVar9 + 8;
    } while (sVar3 << 3 != lVar9);
  }
  ASTSerializer::endArray(serializer);
  name_00._M_str = "rules";
  name_00._M_len = 5;
  ASTSerializer::startArray(serializer,name_00);
  sVar13 = getRules(this);
  pRVar7 = sVar13._M_ptr;
  if (sVar13._M_extent._M_extent_value._M_extent_value != 0) {
    pRVar1 = pRVar7 + sVar13._M_extent._M_extent_value._M_extent_value;
    do {
      ASTSerializer::startObject(serializer);
      name_01._M_str = "prods";
      name_01._M_len = 5;
      ASTSerializer::startArray(serializer,name_01);
      sVar3 = (pRVar7->prods)._M_extent._M_extent_value;
      if (sVar3 != 0) {
        ppPVar11 = (pRVar7->prods)._M_ptr;
        ppPVar2 = ppPVar11 + sVar3;
        do {
          pPVar5 = *ppPVar11;
          ASTSerializer::startObject(serializer);
          switch(pPVar5->kind) {
          case Item:
            ASTSerializer::write(serializer,4,"kind",4);
            name_02._M_str = "item";
            name_02._M_len = 4;
            ASTSerializer::writeProperty(serializer,name_02);
            ASTSerializer::startObject(serializer);
            if (*(Symbol **)(pPVar5 + 2) != (Symbol *)0x0) {
              name_03._M_str = "target";
              name_03._M_len = 6;
              ASTSerializer::writeLink(serializer,name_03,*(Symbol **)(pPVar5 + 2));
            }
            name_04._M_str = "args";
            name_04._M_len = 4;
            ASTSerializer::startArray(serializer,name_04);
            lVar9 = *(long *)(pPVar5 + 6);
            if (lVar9 != 0) {
              lVar6 = *(long *)(pPVar5 + 4);
              lVar12 = 0;
              do {
                ASTSerializer::serialize(serializer,*(Expression **)(lVar6 + lVar12));
                lVar12 = lVar12 + 8;
              } while (lVar9 << 3 != lVar12);
            }
            goto LAB_003452cc;
          case CodeBlock:
            ASTSerializer::write(serializer,4,"kind",9);
            break;
          case IfElse:
            ASTSerializer::write(serializer,4,"kind",6);
            ASTSerializer::write(serializer,4,"expr",*(size_t *)(pPVar5 + 2));
            name_13._M_str = "ifItem";
            name_13._M_len = 6;
            ASTSerializer::writeProperty(serializer,name_13);
            ASTSerializer::startObject(serializer);
            if (*(Symbol **)(pPVar5 + 6) != (Symbol *)0x0) {
              name_14._M_str = "target";
              name_14._M_len = 6;
              ASTSerializer::writeLink(serializer,name_14,*(Symbol **)(pPVar5 + 6));
            }
            name_15._M_str = "args";
            name_15._M_len = 4;
            ASTSerializer::startArray(serializer,name_15);
            lVar9 = *(long *)(pPVar5 + 10);
            if (lVar9 != 0) {
              lVar6 = *(long *)(pPVar5 + 8);
              lVar12 = 0;
              do {
                ASTSerializer::serialize(serializer,*(Expression **)(lVar6 + lVar12));
                lVar12 = lVar12 + 8;
              } while (lVar9 << 3 != lVar12);
            }
            ASTSerializer::endArray(serializer);
            ASTSerializer::endObject(serializer);
            if ((char)pPVar5[0x14].kind == CodeBlock) {
              name_16._M_str = "elseItem";
              name_16._M_len = 8;
              ASTSerializer::writeProperty(serializer,name_16);
              ASTSerializer::startObject(serializer);
              if (*(Symbol **)(pPVar5 + 0xe) != (Symbol *)0x0) {
                name_17._M_str = "target";
                name_17._M_len = 6;
                ASTSerializer::writeLink(serializer,name_17,*(Symbol **)(pPVar5 + 0xe));
              }
              name_18._M_str = "args";
              name_18._M_len = 4;
              ASTSerializer::startArray(serializer,name_18);
              lVar9 = *(long *)(pPVar5 + 0x12);
              if (lVar9 != 0) {
                lVar6 = *(long *)(pPVar5 + 0x10);
                lVar12 = 0;
                do {
                  ASTSerializer::serialize(serializer,*(Expression **)(lVar6 + lVar12));
                  lVar12 = lVar12 + 8;
                } while (lVar9 << 3 != lVar12);
              }
              goto LAB_003452cc;
            }
            break;
          case Repeat:
            ASTSerializer::write(serializer,4,"kind",6);
            ASTSerializer::write(serializer,4,"expr",*(size_t *)(pPVar5 + 2));
            name_19._M_str = "item";
            name_19._M_len = 4;
            ASTSerializer::writeProperty(serializer,name_19);
            ASTSerializer::startObject(serializer);
            if (*(Symbol **)(pPVar5 + 6) != (Symbol *)0x0) {
              name_20._M_str = "target";
              name_20._M_len = 6;
              ASTSerializer::writeLink(serializer,name_20,*(Symbol **)(pPVar5 + 6));
            }
            name_21._M_str = "args";
            name_21._M_len = 4;
            ASTSerializer::startArray(serializer,name_21);
            lVar9 = *(long *)(pPVar5 + 10);
            if (lVar9 != 0) {
              lVar6 = *(long *)(pPVar5 + 8);
              lVar12 = 0;
              do {
                ASTSerializer::serialize(serializer,*(Expression **)(lVar6 + lVar12));
                lVar12 = lVar12 + 8;
              } while (lVar9 << 3 != lVar12);
            }
LAB_003452cc:
            ASTSerializer::endArray(serializer);
            ASTSerializer::endObject(serializer);
            break;
          case Case:
            ASTSerializer::write(serializer,4,"kind",4);
            ASTSerializer::write(serializer,4,"expr",*(size_t *)(pPVar5 + 2));
            if ((char)pPVar5[0x10].kind == CodeBlock) {
              name_05._M_str = "defaultItem";
              name_05._M_len = 0xb;
              ASTSerializer::writeProperty(serializer,name_05);
              ASTSerializer::startObject(serializer);
              if (*(Symbol **)(pPVar5 + 10) != (Symbol *)0x0) {
                name_06._M_str = "target";
                name_06._M_len = 6;
                ASTSerializer::writeLink(serializer,name_06,*(Symbol **)(pPVar5 + 10));
              }
              name_07._M_str = "args";
              name_07._M_len = 4;
              ASTSerializer::startArray(serializer,name_07);
              lVar9 = *(long *)(pPVar5 + 0xe);
              if (lVar9 != 0) {
                lVar6 = *(long *)(pPVar5 + 0xc);
                lVar12 = 0;
                do {
                  ASTSerializer::serialize(serializer,*(Expression **)(lVar6 + lVar12));
                  lVar12 = lVar12 + 8;
                } while (lVar9 << 3 != lVar12);
              }
              ASTSerializer::endArray(serializer);
              ASTSerializer::endObject(serializer);
            }
            name_08._M_str = "items";
            name_08._M_len = 5;
            ASTSerializer::startArray(serializer,name_08);
            if (*(long *)(pPVar5 + 6) != 0) {
              plVar8 = *(long **)(pPVar5 + 4);
              plVar10 = plVar8 + *(long *)(pPVar5 + 6) * 6;
              do {
                ASTSerializer::startObject(serializer);
                name_09._M_str = "expressions";
                name_09._M_len = 0xb;
                ASTSerializer::startArray(serializer,name_09);
                lVar9 = plVar8[1];
                if (lVar9 != 0) {
                  lVar6 = *plVar8;
                  lVar12 = 0;
                  do {
                    ASTSerializer::serialize(serializer,*(Expression **)(lVar6 + lVar12));
                    lVar12 = lVar12 + 8;
                  } while (lVar9 << 3 != lVar12);
                }
                ASTSerializer::endArray(serializer);
                name_10._M_str = "item";
                name_10._M_len = 4;
                ASTSerializer::writeProperty(serializer,name_10);
                ASTSerializer::startObject(serializer);
                if ((Symbol *)plVar8[3] != (Symbol *)0x0) {
                  name_11._M_str = "target";
                  name_11._M_len = 6;
                  ASTSerializer::writeLink(serializer,name_11,(Symbol *)plVar8[3]);
                }
                name_12._M_str = "args";
                name_12._M_len = 4;
                ASTSerializer::startArray(serializer,name_12);
                lVar9 = plVar8[5];
                if (lVar9 != 0) {
                  lVar6 = plVar8[4];
                  lVar12 = 0;
                  do {
                    ASTSerializer::serialize(serializer,*(Expression **)(lVar6 + lVar12));
                    lVar12 = lVar12 + 8;
                  } while (lVar9 << 3 != lVar12);
                }
                ASTSerializer::endArray(serializer);
                ASTSerializer::endObject(serializer);
                ASTSerializer::endObject(serializer);
                plVar8 = plVar8 + 6;
              } while (plVar8 != plVar10);
            }
            ASTSerializer::endArray(serializer);
          }
          ASTSerializer::endObject(serializer);
          ppPVar11 = ppPVar11 + 1;
        } while (ppPVar11 != ppPVar2);
      }
      ASTSerializer::endArray(serializer);
      if (pRVar7->weightExpr != (Expression *)0x0) {
        ASTSerializer::write(serializer,10,"weightExpr",(size_t)pRVar7->weightExpr);
      }
      ASTSerializer::write(serializer,10,"isRandJoin",(ulong)pRVar7->isRandJoin);
      if (pRVar7->randJoinExpr != (Expression *)0x0) {
        ASTSerializer::write(serializer,0xc,"randJoinExpr",(size_t)pRVar7->randJoinExpr);
      }
      ASTSerializer::endObject(serializer);
      pRVar7 = pRVar7 + 1;
    } while (pRVar7 != pRVar1);
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void RandSeqProductionSymbol::serializeTo(ASTSerializer& serializer) const {
    auto writeItem = [&](std::string_view propName, const ProdItem& item) {
        serializer.writeProperty(propName);
        serializer.startObject();
        if (item.target)
            serializer.writeLink("target", *item.target);

        serializer.startArray("args");
        for (auto arg : item.args)
            serializer.serialize(*arg);
        serializer.endArray();

        serializer.endObject();
    };

    serializer.write("returnType", getReturnType());

    serializer.startArray("arguments");
    for (auto arg : arguments)
        serializer.serialize(*arg);
    serializer.endArray();

    serializer.startArray("rules");
    for (auto& rule : getRules()) {
        serializer.startObject();

        serializer.startArray("prods");
        for (auto prod : rule.prods) {
            serializer.startObject();
            switch (prod->kind) {
                case ProdKind::Item:
                    serializer.write("kind", "Item"sv);
                    writeItem("item", *(const ProdItem*)prod);
                    break;
                case ProdKind::CodeBlock:
                    serializer.write("kind", "CodeBlock"sv);
                    break;
                case ProdKind::IfElse: {
                    auto& iep = *(const IfElseProd*)prod;
                    serializer.write("kind", "IfElse"sv);
                    serializer.write("expr", *iep.expr);

                    writeItem("ifItem", iep.ifItem);
                    if (iep.elseItem)
                        writeItem("elseItem", *iep.elseItem);
                    break;
                }
                case ProdKind::Repeat: {
                    auto& rp = *(const RepeatProd*)prod;
                    serializer.write("kind", "Repeat"sv);
                    serializer.write("expr", *rp.expr);
                    writeItem("item", rp.item);
                    break;
                }
                case ProdKind::Case: {
                    auto& cp = *(const CaseProd*)prod;
                    serializer.write("kind", "Case"sv);
                    serializer.write("expr", *cp.expr);
                    if (cp.defaultItem)
                        writeItem("defaultItem", *cp.defaultItem);

                    serializer.startArray("items");
                    for (auto& item : cp.items) {
                        serializer.startObject();
                        serializer.startArray("expressions");
                        for (auto expr : item.expressions)
                            serializer.serialize(*expr);
                        serializer.endArray();

                        writeItem("item", item.item);
                        serializer.endObject();
                    }
                    serializer.endArray();
                    break;
                }
            }
            serializer.endObject();
        }
        serializer.endArray();

        if (rule.weightExpr)
            serializer.write("weightExpr", *rule.weightExpr);

        serializer.write("isRandJoin", rule.isRandJoin);
        if (rule.randJoinExpr)
            serializer.write("randJoinExpr", *rule.randJoinExpr);

        serializer.endObject();
    }
    serializer.endArray();
}